

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_MatchedUnknownFieldTagTest_Test::TestBody
          (ComparisonTest_MatchedUnknownFieldTagTest_Test *this)

{
  UnknownFieldSet *pUVar1;
  bool bVar2;
  char *message;
  AssertHelper local_80;
  Message local_78 [3];
  string local_60;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  string_view local_20;
  ComparisonTest_MatchedUnknownFieldTagTest_Test *local_10;
  ComparisonTest_MatchedUnknownFieldTagTest_Test *this_local;
  
  local_10 = this;
  UnknownFieldSet::AddVarint((this->super_ComparisonTest).unknown1_,0xf0,0x7a);
  UnknownFieldSet::AddVarint((this->super_ComparisonTest).unknown2_,0xf0,0x79);
  UnknownFieldSet::AddFixed32((this->super_ComparisonTest).unknown1_,0xf1,1);
  UnknownFieldSet::AddFixed64((this->super_ComparisonTest).unknown2_,0xf1,2);
  pUVar1 = (this->super_ComparisonTest).unknown1_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"cat");
  UnknownFieldSet::AddLengthDelimited(pUVar1,0xf2,local_20);
  pUVar1 = (this->super_ComparisonTest).unknown2_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"dog");
  UnknownFieldSet::AddLengthDelimited(pUVar1,0xf2,stack0xffffffffffffffd0);
  protobuf::(anonymous_namespace)::ComparisonTest::RunUn_abi_cxx11_(&local_60,this);
  testing::internal::EqHelper::
  Compare<char[125],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_40,
             "\"modified: 240[0]: 122 -> 121\\n\" \"deleted: 241[0]: 0x00000001\\n\" \"added: 241[0]: 0x0000000000000002\\n\" \"modified: 242[0]: \\\"cat\\\" -> \\\"dog\\\"\\n\""
             ,"RunUn()",
             (char (*) [125])
             "modified: 240[0]: 122 -> 121\ndeleted: 241[0]: 0x00000001\nadded: 241[0]: 0x0000000000000002\nmodified: 242[0]: \"cat\" -> \"dog\"\n"
             ,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar2) {
    testing::Message::Message(local_78);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xe9c,message);
    testing::internal::AssertHelper::operator=(&local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

TEST_F(ComparisonTest, MatchedUnknownFieldTagTest) {
  unknown1_->AddVarint(240, 122);
  unknown2_->AddVarint(240, 121);
  unknown1_->AddFixed32(241, 1);
  unknown2_->AddFixed64(241, 2);
  unknown1_->AddLengthDelimited(242, "cat");
  unknown2_->AddLengthDelimited(242, "dog");

  EXPECT_EQ(
      "modified: 240[0]: 122 -> 121\n"
      "deleted: 241[0]: 0x00000001\n"
      "added: 241[0]: 0x0000000000000002\n"
      "modified: 242[0]: \"cat\" -> \"dog\"\n",
      RunUn());
}